

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::BeginRenderPass
          (DeviceContextVkImpl *this,BeginRenderPassAttribs *Attribs)

{
  uint uVar1;
  FramebufferVkImpl *pFVar2;
  RenderPassVkImpl *pRVar3;
  OptimizedClearValue *pOVar4;
  pointer pVVar5;
  TextureFormatAttribs *pTVar6;
  uint uVar7;
  char (*in_RCX) [34];
  BeginRenderPassAttribs *pBVar8;
  ulong uVar9;
  VkClearValue *pClearValues;
  long lVar10;
  long lVar11;
  string msg;
  string local_68;
  BeginRenderPassAttribs *local_48;
  vector<VkClearValue,_std::allocator<VkClearValue>_> *local_40;
  DeviceContextVkImpl *local_38;
  
  local_48 = Attribs;
  DeviceContextBase<Diligent::EngineVkImplTraits>::BeginRenderPass
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs);
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject ==
      (RenderPassVkImpl *)0x0) {
    FormatString<char[26],char[31]>
              (&local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pActiveRenderPass != nullptr",(char (*) [31])in_RCX);
    in_RCX = (char (*) [34])0x7e6;
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7e6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundFramebuffer.m_pObject ==
      (FramebufferVkImpl *)0x0) {
    FormatString<char[26],char[31]>
              (&local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pBoundFramebuffer != nullptr",(char (*) [31])in_RCX);
    in_RCX = (char (*) [34])0x7e7;
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7e7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_vkRenderPass != (VkRenderPass)0x0) {
    FormatString<char[26],char[33]>
              (&local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_vkRenderPass == VK_NULL_HANDLE",(char (*) [33])in_RCX);
    in_RCX = (char (*) [34])0x7e8;
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_vkFramebuffer != (VkFramebuffer)0x0) {
    FormatString<char[26],char[34]>
              (&local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_vkFramebuffer == VK_NULL_HANDLE",in_RCX);
    in_RCX = (char (*) [34])0x7e9;
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7e9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_DynamicRenderingInfo)._M_t.
      super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
      ._M_t.
      super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
      .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl !=
      (RenderingInfoWrapper *)0x0) {
    FormatString<char[26],char[24]>
              (&local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!m_DynamicRenderingInfo",(char (*) [24])in_RCX);
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7ea);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  pBVar8 = local_48;
  pFVar2 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundFramebuffer.m_pObject;
  this->m_vkRenderPass =
       (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject)->
       m_VkRenderPass).m_VkObject;
  this->m_vkFramebuffer = (pFVar2->m_VkFramebuffer).m_VkObject;
  if ((ulong)local_48->ClearValueCount == 0) {
    pClearValues = (VkClearValue *)0x0;
  }
  else {
    local_40 = &this->m_vkClearValues;
    std::vector<VkClearValue,_std::allocator<VkClearValue>_>::resize
              (local_40,(ulong)local_48->ClearValueCount);
    pRVar3 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject;
    uVar1 = pBVar8->ClearValueCount;
    uVar7 = (pRVar3->super_RenderPassBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
            .m_Desc.AttachmentCount;
    if (uVar1 < uVar7) {
      uVar7 = uVar1;
    }
    local_38 = this;
    if (uVar7 != 0) {
      lVar11 = 0x18;
      lVar10 = 0;
      uVar9 = 0;
      do {
        pOVar4 = pBVar8->pClearValues;
        pVVar5 = (local_40->super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        pTVar6 = GetTextureFormatAttribs
                           (*(TEXTURE_FORMAT *)
                             ((long)&((pRVar3->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                                      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                                      .m_Desc.pAttachments)->Format + lVar10));
        if ((byte)(pTVar6->ComponentType - COMPONENT_TYPE_DEPTH) < 2) {
          *(undefined4 *)((long)pVVar5 + lVar10) =
               *(undefined4 *)((long)pOVar4->Color + lVar11 + -8);
          *(uint *)((long)pVVar5 + lVar10 + 4) = (uint)*(byte *)((long)pOVar4->Color + lVar11 + -4);
        }
        else {
          *(undefined4 *)((long)pVVar5 + lVar10) =
               *(undefined4 *)((long)pOVar4->Color + lVar11 + -0x18);
          *(undefined4 *)((long)pVVar5 + lVar10 + 4) =
               *(undefined4 *)((long)pOVar4->Color + lVar11 + -0x14);
          *(undefined4 *)((long)pVVar5 + lVar10 + 8) =
               *(undefined4 *)((long)pOVar4->Color + lVar11 + -0x10);
          *(undefined4 *)((long)pVVar5 + lVar10 + 0xc) =
               *(undefined4 *)((long)pOVar4->Color + lVar11 + -0xc);
        }
        uVar9 = uVar9 + 1;
        uVar1 = (pRVar3->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                .m_Desc.AttachmentCount;
        if (local_48->ClearValueCount < uVar1) {
          uVar1 = local_48->ClearValueCount;
        }
        lVar11 = lVar11 + 0x1c;
        lVar10 = lVar10 + 0x10;
        pBVar8 = local_48;
      } while (uVar9 < uVar1);
    }
    pClearValues = (local_40->super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    this = local_38;
  }
  EnsureVkCmdBuffer(this);
  VulkanUtilities::VulkanCommandBuffer::BeginRenderPass
            (&this->m_CommandBuffer,this->m_vkRenderPass,this->m_vkFramebuffer,
             (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth,
             (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight,
             local_48->ClearValueCount,pClearValues);
  SetViewports(this,1,(Viewport *)0x0,0,0);
  (this->m_State).ShadingRateIsSet = false;
  return;
}

Assistant:

void DeviceContextVkImpl::BeginRenderPass(const BeginRenderPassAttribs& Attribs)
{
    TDeviceContextBase::BeginRenderPass(Attribs);

    VERIFY_EXPR(m_pActiveRenderPass != nullptr);
    VERIFY_EXPR(m_pBoundFramebuffer != nullptr);
    VERIFY_EXPR(m_vkRenderPass == VK_NULL_HANDLE);
    VERIFY_EXPR(m_vkFramebuffer == VK_NULL_HANDLE);
    VERIFY_EXPR(!m_DynamicRenderingInfo);

    m_vkRenderPass  = m_pActiveRenderPass->GetVkRenderPass();
    m_vkFramebuffer = m_pBoundFramebuffer->GetVkFramebuffer();

    VkClearValue* pVkClearValues = nullptr;
    if (Attribs.ClearValueCount > 0)
    {
        m_vkClearValues.resize(Attribs.ClearValueCount);
        const RenderPassDesc& RPDesc = m_pActiveRenderPass->GetDesc();
        for (Uint32 i = 0; i < std::min(RPDesc.AttachmentCount, Attribs.ClearValueCount); ++i)
        {
            const OptimizedClearValue& ClearVal   = Attribs.pClearValues[i];
            VkClearValue&              vkClearVal = m_vkClearValues[i];

            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(RPDesc.pAttachments[i].Format);
            if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
            {
                vkClearVal.depthStencil.depth   = ClearVal.DepthStencil.Depth;
                vkClearVal.depthStencil.stencil = ClearVal.DepthStencil.Stencil;
            }
            else
            {
                vkClearVal.color.float32[0] = ClearVal.Color[0];
                vkClearVal.color.float32[1] = ClearVal.Color[1];
                vkClearVal.color.float32[2] = ClearVal.Color[2];
                vkClearVal.color.float32[3] = ClearVal.Color[3];
            }
        }
        pVkClearValues = m_vkClearValues.data();
    }

    EnsureVkCmdBuffer();
    m_CommandBuffer.BeginRenderPass(m_vkRenderPass, m_vkFramebuffer, m_FramebufferWidth, m_FramebufferHeight, Attribs.ClearValueCount, pVkClearValues);

    // Set the viewport to match the framebuffer size
    SetViewports(1, nullptr, 0, 0);

    m_State.ShadingRateIsSet = false;
}